

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem*,int>>::emplace<QTableWidgetItem*&,int&>
          (QPodArrayOps<std::pair<QTableWidgetItem*,int>> *this,qsizetype i,QTableWidgetItem **args,
          int *args_1)

{
  int iVar1;
  long lVar2;
  long lVar3;
  QTableWidgetItem *pQVar4;
  qsizetype qVar5;
  pair<QTableWidgetItem_*,_int> *ppVar6;
  long lVar7;
  GrowthPosition where;
  
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if ((*(long *)(this + 0x10) == i) &&
       (qVar5 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)this),
       qVar5 != 0)) {
      lVar2 = *(long *)(this + 8);
      lVar3 = *(long *)(this + 0x10);
      lVar7 = lVar3 * 0x10;
      *(QTableWidgetItem **)(lVar2 + lVar7) = *args;
      *(int *)(lVar2 + 8 + lVar7) = *args_1;
      *(long *)(this + 0x10) = lVar3 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)this),
       qVar5 != 0)) {
      lVar2 = *(long *)(this + 8);
      *(QTableWidgetItem **)(lVar2 + -0x10) = *args;
      *(int *)(lVar2 + -8) = *args_1;
      *(long *)(this + 8) = lVar2 + -0x10;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return;
    }
  }
  pQVar4 = *args;
  iVar1 = *args_1;
  where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
  QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)this,where,1,
             (pair<QTableWidgetItem_*,_int> **)0x0,
             (QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *)0x0);
  ppVar6 = QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_>::createHole
                     ((QPodArrayOps<std::pair<QTableWidgetItem_*,_int>_> *)this,where,i,1);
  ppVar6->first = pQVar4;
  ppVar6->second = iVar1;
  *(undefined4 *)&ppVar6->field_0xc = 0xaaaaaaaa;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }